

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O3

int __thiscall
vkt::memory::anon_unknown_0::ImageCopyFromImage::verify
          (ImageCopyFromImage *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
          size_t tbslen)

{
  ulong *puVar1;
  ulong uVar2;
  long lVar3;
  int iVar4;
  deUint32 dVar5;
  deUint32 dVar6;
  deUint32 dVar7;
  deUint32 dVar8;
  ulong uVar10;
  int y;
  int iVar11;
  Vector<int,_4> res;
  Random rng;
  IVec4 local_78;
  deRandom local_68;
  PixelBufferAccess local_58;
  PixelBufferAccess *pPVar9;
  
  deRandom_init(&local_68,this->m_seed);
  uVar2 = this->m_imageMemorySize;
  if (uVar2 != 0) {
    lVar3 = *(long *)(ctx + 0x30);
    uVar10 = 0;
    do {
      puVar1 = (ulong *)(lVar3 + (uVar10 >> 6) * 8);
      *puVar1 = *puVar1 | 1L << ((byte)uVar10 & 0x3f);
      uVar10 = uVar10 + 1;
    } while (uVar2 != uVar10);
  }
  pPVar9 = tcu::TextureLevel::getAccess(&local_58,(TextureLevel *)(ctx + 0x48));
  iVar4 = (int)pPVar9;
  iVar11 = this->m_imageHeight;
  if (0 < iVar11) {
    iVar4 = this->m_imageWidth;
    y = 0;
    do {
      if (0 < iVar4) {
        iVar11 = 0;
        do {
          dVar5 = deRandom_getUint32(&local_68);
          dVar6 = deRandom_getUint32(&local_68);
          dVar7 = deRandom_getUint32(&local_68);
          dVar8 = deRandom_getUint32(&local_68);
          local_78.m_data[0] = dVar5 & 0xff;
          local_78.m_data[1] = dVar6 & 0xff;
          local_78.m_data[2] = dVar7 & 0xff;
          local_78.m_data[3] = dVar8 & 0xff;
          tcu::PixelBufferAccess::setPixel(&local_58,&local_78,iVar11,y,0);
          iVar11 = iVar11 + 1;
          iVar4 = this->m_imageWidth;
        } while (iVar11 < iVar4);
        iVar11 = this->m_imageHeight;
      }
      y = y + 1;
    } while (y < iVar11);
  }
  return iVar4;
}

Assistant:

void ImageCopyFromImage::verify (VerifyContext& context, size_t)
{
	ReferenceMemory&	reference	(context.getReference());
	de::Random			rng			(m_seed);

	reference.setUndefined(0, (size_t)m_imageMemorySize);

	{
		const PixelBufferAccess&	refAccess	(context.getReferenceImage().getAccess());

		for (deInt32 y = 0; y < m_imageHeight; y++)
		for (deInt32 x = 0; x < m_imageWidth; x++)
		{
			const deUint8 r8 = rng.getUint8();
			const deUint8 g8 = rng.getUint8();
			const deUint8 b8 = rng.getUint8();
			const deUint8 a8 = rng.getUint8();

			refAccess.setPixel(UVec4(r8, g8, b8, a8), x, y);
		}
	}
}